

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var * __thiscall cs::domain_manager::get_var(domain_manager *this,var_id *id)

{
  bool bVar1;
  var_id *pvVar2;
  size_t sVar3;
  var *pvVar4;
  domain_type *pdVar5;
  string *str;
  var_id *in_RSI;
  domain_type *in_RDI;
  size_t size_1;
  size_t i_1;
  size_t size;
  size_t i;
  var_id *in_stack_ffffffffffffff58;
  domain_type *in_stack_ffffffffffffff60;
  domain_type *this_00;
  var_id *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t local_30;
  size_t local_20;
  
  if (*(long *)(in_RDI->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_ != 0) {
    in_stack_ffffffffffffff68 = (var_id *)in_RSI->m_domain_id;
    pvVar2 = (var_id *)
             stack_type<cs::domain_type,_std::allocator>::size
                       (*(stack_type<cs::domain_type,_std::allocator> **)
                         (in_RDI->m_reflect).
                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         .
                         super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         .ctrl_);
    if (in_stack_ffffffffffffff68 < pvVar2) {
      stack_type<cs::domain_type,_std::allocator>::operator[]
                (*(stack_type<cs::domain_type,_std::allocator> **)
                  (in_RDI->m_reflect).
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  .ctrl_,in_RSI->m_domain_id);
      bVar1 = domain_type::consistence(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        stack_type<cs::domain_type,_std::allocator>::operator[]
                  (*(stack_type<cs::domain_type,_std::allocator> **)
                    (in_RDI->m_reflect).
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .ctrl_,in_RSI->m_domain_id);
        pvVar4 = domain_type::get_var_by_id
                           (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
        return pvVar4;
      }
    }
    local_20 = 0;
    sVar3 = stack_type<cs::domain_type,_std::allocator>::size
                      (*(stack_type<cs::domain_type,_std::allocator> **)
                        (in_RDI->m_reflect).
                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .
                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .ctrl_);
    for (; local_20 < sVar3; local_20 = local_20 + 1) {
      stack_type<cs::domain_type,_std::allocator>::operator[]
                (*(stack_type<cs::domain_type,_std::allocator> **)
                  (in_RDI->m_reflect).
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  .ctrl_,local_20);
      bVar1 = domain_type::exist(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        stack_type<cs::domain_type,_std::allocator>::operator[]
                  (*(stack_type<cs::domain_type,_std::allocator> **)
                    (in_RDI->m_reflect).
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .ctrl_,local_20);
        pvVar4 = domain_type::get_var_no_check
                           (in_RDI,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        return pvVar4;
      }
    }
  }
  this_00 = (domain_type *)in_RSI->m_domain_id;
  pdVar5 = (domain_type *)
           stack_type<cs::domain_type,_std::allocator>::size
                     ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref);
  if (this_00 < pdVar5) {
    stack_type<cs::domain_type,_std::allocator>::operator[]
              ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref,in_RSI->m_domain_id);
    bVar1 = domain_type::consistence(this_00,in_stack_ffffffffffffff58);
    if (bVar1) {
      stack_type<cs::domain_type,_std::allocator>::operator[]
                ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref,in_RSI->m_domain_id);
      pvVar4 = domain_type::get_var_by_id(this_00,(size_t)in_stack_ffffffffffffff58);
      return pvVar4;
    }
  }
  local_30 = 0;
  sVar3 = stack_type<cs::domain_type,_std::allocator>::size
                    ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref);
  while( true ) {
    if (sVar3 <= local_30) {
      str = (string *)__cxa_allocate_exception(0x28);
      var_id::get_id_abi_cxx11_(in_RSI);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff68,(char *)this_00);
      runtime_error::runtime_error((runtime_error *)this_00,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    stack_type<cs::domain_type,_std::allocator>::operator[]
              ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref,local_30);
    bVar1 = domain_type::exist(this_00,in_stack_ffffffffffffff58);
    if (bVar1) break;
    local_30 = local_30 + 1;
  }
  stack_type<cs::domain_type,_std::allocator>::operator[]
            ((stack_type<cs::domain_type,_std::allocator> *)&in_RDI->m_ref,local_30);
  pvVar4 = domain_type::get_var_no_check(in_RDI,in_stack_ffffffffffffff68,(size_t)this_00);
  return pvVar4;
}

Assistant:

inline var &get_var(const var_id &id)
		{
			if (fiber_stack != nullptr) {
				if (id.m_domain_id < fiber_stack->size() && (*fiber_stack)[id.m_domain_id].consistence(id))
					return (*fiber_stack)[id.m_domain_id].get_var_by_id(id.m_slot_id);
				for (std::size_t i = 0, size = fiber_stack->size(); i < size; ++i)
					if ((*fiber_stack)[i].exist(id))
						return (*fiber_stack)[i].get_var_no_check(id, i);
			}
			if (id.m_domain_id < m_data.size() && m_data[id.m_domain_id].consistence(id))
				return m_data[id.m_domain_id].get_var_by_id(id.m_slot_id);
			for (std::size_t i = 0, size = m_data.size(); i < size; ++i)
				if (m_data[i].exist(id))
					return m_data[i].get_var_no_check(id, i);
			throw runtime_error("Use of undefined variable \"" + id.get_id() + "\".");
		}